

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string * __thiscall
slang::parsing::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  SyntaxPrinter *this_00;
  SyntaxPrinter local_48;
  Token *local_18;
  Token *this_local;
  
  local_48.sourceManager = (SourceManager *)0x0;
  local_48.includeTrivia = false;
  local_48.includeMissing = false;
  local_48.includeSkipped = false;
  local_48.includeDirectives = false;
  local_48.includePreprocessed = false;
  local_48.includeComments = false;
  local_48.squashNewlines = false;
  local_48._47_1_ = 0;
  local_48.buffer.field_2._M_allocated_capacity = 0;
  local_48.buffer.field_2._8_8_ = 0;
  local_48.buffer._M_dataplus = (_Alloc_hider)0x0;
  local_48.buffer._1_7_ = 0;
  local_48.buffer._M_string_length = 0;
  local_18 = this;
  this_local = (Token *)__return_storage_ptr__;
  slang::syntax::SyntaxPrinter::SyntaxPrinter(&local_48);
  this_00 = slang::syntax::SyntaxPrinter::print(&local_48,*this);
  slang::syntax::SyntaxPrinter::str_abi_cxx11_(__return_storage_ptr__,this_00);
  slang::syntax::SyntaxPrinter::~SyntaxPrinter(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Token::toString() const {
    return SyntaxPrinter().print(*this).str();
}